

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Promise<kj::AuthenticatedStream>
kj::anon_unknown_0::NetworkAddressImpl::connectImpl
          (LowLevelAsyncIoProvider *lowLevel,NetworkFilter *filter,
          ArrayPtr<kj::(anonymous_namespace)::SocketAddress> addrs,bool authenticated)

{
  OwnPromiseNode node;
  undefined8 uVar1;
  undefined8 uVar2;
  char *node_00;
  char cVar3;
  void *pvVar4;
  OwnPromiseNode extraout_RAX;
  PromiseNode *extraout_RAX_00;
  PromiseArena *pPVar5;
  PromiseArena *pPVar6;
  SocketAddress *pSVar7;
  PromiseArenaMember *pPVar8;
  Exception *e;
  TransformPromiseNodeBase *this;
  undefined7 in_register_00000081;
  PromiseArena *pPVar9;
  undefined1 in_R9B;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault f;
  OwnPromiseNode local_5c0;
  undefined1 local_5b4;
  PromiseArena *local_5b0;
  undefined1 local_5a8 [40];
  PromiseDisposer local_580 [96];
  LowLevelAsyncIoProvider *local_520;
  undefined1 local_4f8 [16];
  char *local_4e8;
  size_t local_4e0;
  bool local_4d8;
  LowLevelAsyncIoProvider local_360 [51];
  Exception local_1c8;
  
  pPVar9 = (PromiseArena *)CONCAT71(in_register_00000081,authenticated);
  pPVar5 = (PromiseArena *)addrs.size_;
  pSVar7 = addrs.ptr;
  local_4f8._8_8_ = local_4f8._8_8_ & 0xffffffff00000000;
  local_4e8 = " > ";
  local_4e0 = 4;
  local_4d8 = pPVar9 != (PromiseArena *)0x0;
  local_5b0 = (PromiseArena *)filter;
  local_4f8._0_8_ = pPVar9;
  if (!local_4d8) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              ((Fault *)local_360,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x665,FAILED,"addrs.size() > 0","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)local_4f8);
    kj::_::Debug::Fault::fatal((Fault *)local_360);
  }
  local_5c0.ptr = (PromiseNode *)0x0;
  pPVar6 = pPVar5;
  local_520 = lowLevel;
  local_5b4 = in_R9B;
  cVar3 = (*(code *)**(undefined8 **)pSVar7)(pSVar7,pPVar5->bytes + 8,*(undefined4 *)pPVar5->bytes);
  if (cVar3 == '\0') {
    kj::_::Debug::makeDescription<char_const(&)[37]>
              ((String *)local_5a8,(Debug *)"\"connect() blocked by restrictPeers()\"",
               "connect() blocked by restrictPeers()",(char (*) [37])pPVar6);
    Exception::Exception
              (&local_1c8,FAILED,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x669,(String *)local_5a8);
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
              (local_580,&local_1c8);
    pPVar8 = (PromiseArenaMember *)CONCAT44(local_580._4_4_,local_580._0_4_);
    Exception::~Exception(&local_1c8);
    uVar2 = local_5a8._8_8_;
    uVar1 = local_5a8._0_8_;
    if ((char *)local_5a8._0_8_ != (char *)0x0) {
      local_5a8._0_8_ = (char *)0x0;
      local_5a8._8_8_ = 0;
      (*(code *)**(undefined8 **)local_5a8._16_8_)(local_5a8._16_8_,uVar1,1,uVar2,uVar2,0);
    }
  }
  else {
    SocketAddress::socket((SocketAddress *)local_5a8,(int)addrs.size_,1,(int)pPVar6);
    LowLevelAsyncIoProvider::wrapConnectingSocketFd
              ((LowLevelAsyncIoProvider *)(local_5a8 + 0x20),(OwnFd *)local_5b0,
               (sockaddr *)local_5a8,(uint)(pPVar5->bytes + 8),*(uint *)pPVar5->bytes);
    OwnFd::~OwnFd((OwnFd *)local_5a8);
    pPVar8 = (PromiseArenaMember *)local_5a8._32_8_;
  }
  local_4f8._0_8_ = local_4f8._0_8_ & 0xffffffffffffff00;
  pPVar6 = pPVar8->arena;
  local_5c0.ptr = (PromiseNode *)pPVar8;
  if (pPVar6 == (PromiseArena *)0x0 || (ulong)((long)pPVar8 - (long)pPVar6) < 0x70) {
    pvVar4 = operator_new(0x400);
    this = (TransformPromiseNodeBase *)((long)pvVar4 + 0x390);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,&local_5c0,
               kj::_::
               TransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1647:13),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1656:8)>
               ::anon_class_40_4_9eb916ad_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x390) = &PTR_destroy_006e1be8;
    *(PromiseArena **)((long)pvVar4 + 0x3b0) = local_5b0;
    *(SocketAddress **)((long)pvVar4 + 0x3b8) = pSVar7;
    *(PromiseArena **)((long)pvVar4 + 0x3c0) = pPVar5;
    *(PromiseArena **)((long)pvVar4 + 0x3c8) = pPVar9;
    *(undefined1 *)((long)pvVar4 + 0x3d0) = local_5b4;
    *(PromiseArena **)((long)pvVar4 + 0x3d8) = local_5b0;
    *(SocketAddress **)((long)pvVar4 + 0x3e0) = pSVar7;
    *(PromiseArena **)((long)pvVar4 + 1000) = pPVar5;
    *(PromiseArena **)((long)pvVar4 + 0x3f0) = pPVar9;
    *(undefined1 *)((long)pvVar4 + 0x3f8) = local_5b4;
    *(void **)((long)pvVar4 + 0x398) = pvVar4;
  }
  else {
    pPVar8->arena = (PromiseArena *)0x0;
    this = (TransformPromiseNodeBase *)(pPVar8 + -7);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,&local_5c0,
               kj::_::
               TransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1647:13),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1656:8)>
               ::anon_class_40_4_9eb916ad_for_func::operator());
    pPVar8[-7]._vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_006e1be8;
    pPVar8[-5]._vptr_PromiseArenaMember = (_func_int **)local_5b0;
    pPVar8[-5].arena = (PromiseArena *)pSVar7;
    pPVar8[-4]._vptr_PromiseArenaMember = (_func_int **)pPVar5;
    pPVar8[-4].arena = pPVar9;
    *(undefined1 *)&pPVar8[-3]._vptr_PromiseArenaMember = local_5b4;
    *(undefined4 *)((long)&pPVar8[-3]._vptr_PromiseArenaMember + 1) = local_580._0_4_;
    *(uint *)((long)&pPVar8[-3]._vptr_PromiseArenaMember + 4) =
         CONCAT31(local_580._4_3_,local_580[3]);
    pPVar8[-3].arena = local_5b0;
    pPVar8[-2]._vptr_PromiseArenaMember = (_func_int **)pSVar7;
    pPVar8[-2].arena = pPVar5;
    pPVar8[-1]._vptr_PromiseArenaMember = (_func_int **)pPVar9;
    *(undefined1 *)&pPVar8[-1].arena = local_5b4;
    *(undefined4 *)((long)&pPVar8[-1].arena + 1) = local_580._9_4_;
    *(uint *)((long)&pPVar8[-1].arena + 4) = CONCAT31(local_580._13_3_,local_580[0xc]);
    pPVar8[-7].arena = pPVar6;
  }
  local_4f8._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
  ;
  local_4f8._8_8_ = "connectImpl";
  local_4e8 = (char *)0xc00000667;
  local_1c8.ownFile.content.ptr = (char *)this;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)local_360,(OwnPromiseNode *)&local_1c8,(SourceLocation *)local_4f8);
  node_00 = local_1c8.ownFile.content.ptr;
  local_520->_vptr_LowLevelAsyncIoProvider = local_360[0]._vptr_LowLevelAsyncIoProvider;
  if ((TransformPromiseNodeBase *)local_1c8.ownFile.content.ptr != (TransformPromiseNodeBase *)0x0)
  {
    local_1c8.ownFile.content.ptr = (char *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00);
    local_360[0]._vptr_LowLevelAsyncIoProvider = (_func_int **)extraout_RAX.ptr;
  }
  node.ptr = local_5c0.ptr;
  if (&(local_5c0.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_5c0.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
    local_360[0]._vptr_LowLevelAsyncIoProvider = (_func_int **)extraout_RAX_00;
  }
  return (Promise<kj::AuthenticatedStream>)local_360[0]._vptr_LowLevelAsyncIoProvider;
}

Assistant:

static Promise<AuthenticatedStream> connectImpl(
      LowLevelAsyncIoProvider& lowLevel,
      LowLevelAsyncIoProvider::NetworkFilter& filter,
      ArrayPtr<SocketAddress> addrs,
      bool authenticated) {
    KJ_ASSERT(addrs.size() > 0);

    return kj::evalNow([&]() -> Promise<Own<AsyncIoStream>> {
      if (!addrs[0].allowedBy(filter)) {
        return KJ_EXCEPTION(FAILED, "connect() blocked by restrictPeers()");
      } else {
        auto fd = addrs[0].socket(SOCK_STREAM);
        return lowLevel.wrapConnectingSocketFd(
            kj::mv(fd), addrs[0].getRaw(), addrs[0].getRawSize(), NEW_FD_FLAGS);
      }
    }).then([&lowLevel,&filter,addrs,authenticated](Own<AsyncIoStream>&& stream)
        -> Promise<AuthenticatedStream> {
      // Success, pass along.
      AuthenticatedStream result;
      result.stream = kj::mv(stream);
      if (authenticated) {
        result.peerIdentity = addrs[0].getIdentity(lowLevel, filter, *result.stream);
      }
      return kj::mv(result);
    }, [&lowLevel,&filter,addrs,authenticated](Exception&& exception) mutable
        -> Promise<AuthenticatedStream> {
      // Connect failed.
      if (addrs.size() > 1) {
        // Try the next address instead.
        return connectImpl(lowLevel, filter, addrs.slice(1, addrs.size()), authenticated);
      } else {
        // No more addresses to try, so propagate the exception.
        return kj::mv(exception);
      }
    });
  }